

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall
kj::_::NetworkFilter::NetworkFilter
          (NetworkFilter *this,ArrayPtr<const_kj::StringPtr> allow,
          ArrayPtr<const_kj::StringPtr> deny,NetworkFilter *next)

{
  StringPtr pattern;
  StringPtr pattern_00;
  bool bVar1;
  StringPtr *pSVar2;
  ArrayPtr<const_kj::CidrRange> AVar3;
  CidrRange local_210;
  StringPtr local_1f8;
  StringPtr local_1e8;
  Fault local_1d8;
  Fault f_1;
  ArrayPtr<const_kj::CidrRange> local_1c0;
  StringPtr local_1b0;
  Fault local_1a0;
  Fault f;
  ArrayPtr<const_kj::CidrRange> local_188;
  StringPtr local_178;
  undefined1 auStack_168 [8];
  StringPtr rule_1;
  StringPtr *__end2_1;
  StringPtr *__begin2_1;
  ArrayPtr<const_kj::StringPtr> *__range2_1;
  CidrRange local_120;
  StringPtr local_108;
  StringPtr local_f8;
  StringPtr local_e8;
  ArrayPtr<const_kj::CidrRange> local_d8;
  ArrayPtr<const_kj::CidrRange> local_c8;
  StringPtr local_b8;
  StringPtr local_a8;
  ArrayPtr<const_kj::CidrRange> local_98;
  StringPtr local_88;
  undefined1 auStack_78 [8];
  StringPtr rule;
  StringPtr *__end2;
  StringPtr *__begin2;
  ArrayPtr<const_kj::StringPtr> *__range2;
  NetworkFilter *next_local;
  NetworkFilter *this_local;
  ArrayPtr<const_kj::StringPtr> deny_local;
  ArrayPtr<const_kj::StringPtr> allow_local;
  
  deny_local.size_ = (size_t)allow.ptr;
  deny_local.ptr = (StringPtr *)deny.size_;
  this_local = (NetworkFilter *)deny.ptr;
  LowLevelAsyncIoProvider::NetworkFilter::NetworkFilter(&this->super_NetworkFilter);
  (this->super_NetworkFilter)._vptr_NetworkFilter = (_func_int **)&PTR_shouldAllow_00d9b978;
  Vector<kj::CidrRange>::Vector(&this->allowCidrs);
  Vector<kj::CidrRange>::Vector(&this->denyCidrs);
  this->allowUnix = false;
  this->allowAbstractUnix = false;
  this->allowPublic = false;
  this->allowNetwork = false;
  Maybe<kj::_::NetworkFilter_&>::Maybe(&this->next,next);
  __end2 = ArrayPtr<const_kj::StringPtr>::begin((ArrayPtr<const_kj::StringPtr> *)&deny_local.size_);
  pSVar2 = ArrayPtr<const_kj::StringPtr>::end((ArrayPtr<const_kj::StringPtr> *)&deny_local.size_);
  for (; __end2 != pSVar2; __end2 = __end2 + 1) {
    auStack_78 = (undefined1  [8])(__end2->content).ptr;
    rule.content.ptr = (char *)(__end2->content).size_;
    StringPtr::StringPtr(&local_88,"local");
    bVar1 = StringPtr::operator==((StringPtr *)auStack_78,&local_88);
    if (bVar1) {
      AVar3 = localCidrs();
      local_98 = AVar3;
      Vector<kj::CidrRange>::addAll<kj::ArrayPtr<kj::CidrRange_const>>(&this->allowCidrs,&local_98);
    }
    else {
      StringPtr::StringPtr(&local_a8,"network");
      bVar1 = StringPtr::operator==((StringPtr *)auStack_78,&local_a8);
      if (bVar1) {
        this->allowNetwork = true;
      }
      else {
        StringPtr::StringPtr(&local_b8,"private");
        bVar1 = StringPtr::operator==((StringPtr *)auStack_78,&local_b8);
        if (bVar1) {
          AVar3 = privateCidrs();
          local_c8 = AVar3;
          Vector<kj::CidrRange>::addAll<kj::ArrayPtr<kj::CidrRange_const>>
                    (&this->allowCidrs,&local_c8);
          AVar3 = localCidrs();
          local_d8 = AVar3;
          Vector<kj::CidrRange>::addAll<kj::ArrayPtr<kj::CidrRange_const>>
                    (&this->allowCidrs,&local_d8);
        }
        else {
          StringPtr::StringPtr(&local_e8,"public");
          bVar1 = StringPtr::operator==((StringPtr *)auStack_78,&local_e8);
          if (bVar1) {
            this->allowPublic = true;
          }
          else {
            StringPtr::StringPtr(&local_f8,"unix");
            bVar1 = StringPtr::operator==((StringPtr *)auStack_78,&local_f8);
            if (bVar1) {
              this->allowUnix = true;
            }
            else {
              StringPtr::StringPtr(&local_108,"unix-abstract");
              bVar1 = StringPtr::operator==((StringPtr *)auStack_78,&local_108);
              if (bVar1) {
                this->allowAbstractUnix = true;
              }
              else {
                pattern_00.content.size_ = (size_t)rule.content.ptr;
                pattern_00.content.ptr = (char *)auStack_78;
                CidrRange::CidrRange(&local_120,pattern_00);
                Vector<kj::CidrRange>::add<kj::CidrRange>(&this->allowCidrs,&local_120);
              }
            }
          }
        }
      }
    }
  }
  __end2_1 = ArrayPtr<const_kj::StringPtr>::begin((ArrayPtr<const_kj::StringPtr> *)&this_local);
  pSVar2 = ArrayPtr<const_kj::StringPtr>::end((ArrayPtr<const_kj::StringPtr> *)&this_local);
  do {
    if (__end2_1 == pSVar2) {
      return;
    }
    auStack_168 = (undefined1  [8])(__end2_1->content).ptr;
    rule_1.content.ptr = (char *)(__end2_1->content).size_;
    StringPtr::StringPtr(&local_178,"local");
    bVar1 = StringPtr::operator==((StringPtr *)auStack_168,&local_178);
    if (bVar1) {
      AVar3 = localCidrs();
      local_188 = AVar3;
      Vector<kj::CidrRange>::addAll<kj::ArrayPtr<kj::CidrRange_const>>(&this->denyCidrs,&local_188);
    }
    else {
      StringPtr::StringPtr((StringPtr *)&f,"network");
      bVar1 = StringPtr::operator==((StringPtr *)auStack_168,(StringPtr *)&f);
      if (bVar1) {
        Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
                  (&local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                   ,0xc28,FAILED,(char *)0x0,"\"don\'t deny \'network\', allow \'local\' instead\"",
                   (char (*) [44])"don\'t deny \'network\', allow \'local\' instead");
        Debug::Fault::fatal(&local_1a0);
      }
      StringPtr::StringPtr(&local_1b0,"private");
      bVar1 = StringPtr::operator==((StringPtr *)auStack_168,&local_1b0);
      if (bVar1) {
        AVar3 = privateCidrs();
        local_1c0 = AVar3;
        Vector<kj::CidrRange>::addAll<kj::ArrayPtr<kj::CidrRange_const>>
                  (&this->denyCidrs,&local_1c0);
      }
      else {
        StringPtr::StringPtr((StringPtr *)&f_1,"public");
        bVar1 = StringPtr::operator==((StringPtr *)auStack_168,(StringPtr *)&f_1);
        if (bVar1) {
          Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                    (&local_1d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                     ,0xc2d,FAILED,(char *)0x0,
                     "\"don\'t deny \'public\', allow \'private\' instead\"",
                     (char (*) [45])"don\'t deny \'public\', allow \'private\' instead");
          Debug::Fault::fatal(&local_1d8);
        }
        StringPtr::StringPtr(&local_1e8,"unix");
        bVar1 = StringPtr::operator==((StringPtr *)auStack_168,&local_1e8);
        if (bVar1) {
          this->allowUnix = false;
        }
        else {
          StringPtr::StringPtr(&local_1f8,"unix-abstract");
          bVar1 = StringPtr::operator==((StringPtr *)auStack_168,&local_1f8);
          if (bVar1) {
            this->allowAbstractUnix = false;
          }
          else {
            pattern.content.size_ = (size_t)rule_1.content.ptr;
            pattern.content.ptr = (char *)auStack_168;
            CidrRange::CidrRange(&local_210,pattern);
            Vector<kj::CidrRange>::add<kj::CidrRange>(&this->denyCidrs,&local_210);
          }
        }
      }
    }
    __end2_1 = __end2_1 + 1;
  } while( true );
}

Assistant:

NetworkFilter::NetworkFilter(ArrayPtr<const StringPtr> allow, ArrayPtr<const StringPtr> deny,
                             NetworkFilter& next)
    : allowUnix(false), allowAbstractUnix(false), next(next) {
  for (auto rule: allow) {
    if (rule == "local") {
      allowCidrs.addAll(localCidrs());
    } else if (rule == "network") {
      // Can't be represented as a simple union of CIDRs, so we handle in shouldAllow().
      allowNetwork = true;
    } else if (rule == "private") {
      allowCidrs.addAll(privateCidrs());
      allowCidrs.addAll(localCidrs());
    } else if (rule == "public") {
      // Can't be represented as a simple union of CIDRs, so we handle in shouldAllow().
      allowPublic = true;
    } else if (rule == "unix") {
      allowUnix = true;
    } else if (rule == "unix-abstract") {
      allowAbstractUnix = true;
    } else {
      allowCidrs.add(CidrRange(rule));
    }
  }

  for (auto rule: deny) {
    if (rule == "local") {
      denyCidrs.addAll(localCidrs());
    } else if (rule == "network") {
      KJ_FAIL_REQUIRE("don't deny 'network', allow 'local' instead");
    } else if (rule == "private") {
      denyCidrs.addAll(privateCidrs());
    } else if (rule == "public") {
      // Tricky: What if we allow 'network' and deny 'public'?
      KJ_FAIL_REQUIRE("don't deny 'public', allow 'private' instead");
    } else if (rule == "unix") {
      allowUnix = false;
    } else if (rule == "unix-abstract") {
      allowAbstractUnix = false;
    } else {
      denyCidrs.add(CidrRange(rule));
    }
  }
}